

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_impl.cpp
# Opt level: O0

UChar32 errorValue(int32_t count,int8_t strict)

{
  UChar32 UStack_c;
  int8_t strict_local;
  int32_t count_local;
  
  if (strict < '\0') {
    if (strict == -3) {
      UStack_c = 0xfffd;
    }
    else {
      UStack_c = -1;
    }
  }
  else {
    UStack_c = utf8_errorValue[count];
  }
  return UStack_c;
}

Assistant:

static UChar32
errorValue(int32_t count, int8_t strict) {
    if(strict>=0) {
        return utf8_errorValue[count];
    } else if(strict==-3) {
        return 0xfffd;
    } else {
        return U_SENTINEL;
    }
}